

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_options.h
# Opt level: O0

void BamTools::Options::AddValueOption<std::__cxx11::string>
               (string *argument,string *valueDescription,string *optionDescription,
               string *valueTypeDescription,bool *foundArgument,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val,
               OptionGroup *group)

{
  mapped_type *pmVar1;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  key_type *in_R9;
  OptionValue ov;
  Option o;
  Variant *in_stack_fffffffffffffed8;
  Option *this;
  value_type *in_stack_fffffffffffffee8;
  OptionValue *in_stack_fffffffffffffef0;
  Option *in_stack_ffffffffffffff00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue>_>_>
  *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  Variant *in_stack_ffffffffffffff30;
  Option local_a0;
  key_type *local_30;
  string *local_20;
  string *local_18;
  string *local_10;
  string *local_8;
  
  this = &local_a0;
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Option::Option(in_stack_ffffffffffffff00);
  std::__cxx11::string::operator=((string *)this,local_8);
  std::__cxx11::string::operator=((string *)&local_a0.ValueDescription,local_10);
  std::__cxx11::string::operator=((string *)&local_a0.Description,local_18);
  std::vector<BamTools::Option,_std::allocator<BamTools::Option>_>::push_back
            ((vector<BamTools::Option,_std::allocator<BamTools::Option>_> *)
             in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  OptionValue::OptionValue(in_stack_fffffffffffffef0);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffee8,(string *)local_30);
  Variant::Variant<std::__cxx11::string>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  Variant::operator=((Variant *)this,in_stack_fffffffffffffed8);
  Variant::~Variant((Variant *)this);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  std::__cxx11::string::empty();
  std::__cxx11::string::operator=((string *)&stack0xffffffffffffff20,local_20);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BamTools::OptionValue>_>_>
           ::operator[](in_stack_ffffffffffffff20,local_30);
  OptionValue::operator=((OptionValue *)this,pmVar1);
  OptionValue::~OptionValue((OptionValue *)this);
  Option::~Option(this);
  return;
}

Assistant:

void Options::AddValueOption(const std::string& argument, const std::string& valueDescription,
                             const std::string& optionDescription,
                             const std::string& valueTypeDescription, bool& foundArgument, T& val,
                             OptionGroup* group)
{
    Option o;
    o.Argument = argument;
    o.ValueDescription = valueDescription;
    o.Description = optionDescription;
    group->Options.push_back(o);

    OptionValue ov;
    ov.pFoundArgument = &foundArgument;
    ov.pValue = (void*)&val;
    ov.VariantValue = val;
    ov.IsRequired = (valueTypeDescription.empty() ? false : true);
    ov.ValueTypeDescription = valueTypeDescription;
    m_optionsMap[argument] = ov;
}